

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86CVTTSD2SI(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,
                int shift)

{
  uint uVar1;
  uchar *puVar2;
  uchar *start;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  if (size == sQWORD) {
    *stream = 0xf2;
    uVar1 = encodeRex(stream + 1,false,dst,index,base);
    puVar2 = stream + 1 + uVar1;
    *puVar2 = '\x0f';
    puVar2[1] = ',';
    uVar1 = encodeAddress(puVar2 + 2,index,multiplier,base,shift,(int)regCode[dst]);
    return ((int)(puVar2 + 2) + uVar1) - (int)stream;
  }
  __assert_fail("size == sQWORD",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x1b8,
                "int x86CVTTSD2SI(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)");
}

Assistant:

int x86CVTTSD2SI(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sQWORD);
	(void)size;

	*stream++ = 0xf2;
	stream += encodeRex(stream, false, dst, index, base);
	*stream++ = 0x0f;
	*stream++ = 0x2C;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}